

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.h
# Opt level: O3

void __thiscall cmQtAutoGenInitializer::MocT::MocT(MocT *this)

{
  _Rb_tree_header *p_Var1;
  string_view sVar2;
  
  (this->super_GenVarsT).Enabled = false;
  (this->super_GenVarsT).Gen = MOC;
  sVar2 = cmQtAutoGen::GeneratorNameUpper(MOC);
  (this->super_GenVarsT).GenNameUpper = sVar2;
  (this->super_GenVarsT).ExecutableTargetName._M_dataplus._M_p =
       (pointer)&(this->super_GenVarsT).ExecutableTargetName.field_2;
  (this->super_GenVarsT).ExecutableTargetName._M_string_length = 0;
  (this->super_GenVarsT).ExecutableTargetName.field_2._M_local_buf[0] = '\0';
  (this->super_GenVarsT).ExecutableTarget = (cmGeneratorTarget *)0x0;
  (this->super_GenVarsT).Executable._M_dataplus._M_p =
       (pointer)&(this->super_GenVarsT).Executable.field_2;
  (this->super_GenVarsT).Executable._M_string_length = 0;
  (this->super_GenVarsT).Executable.field_2._M_local_buf[0] = '\0';
  (this->super_GenVarsT).ExecutableFeatures.
  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_GenVarsT).ExecutableFeatures.
  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->RelaxedMode = false;
  this->PathPrefix = false;
  (this->CompilationFile).Default._M_dataplus._M_p =
       (pointer)&(this->CompilationFile).Default.field_2;
  (this->CompilationFile).Default._M_string_length = 0;
  (this->CompilationFile).Default.field_2._M_local_buf[0] = '\0';
  (this->CompilationFile).Config._M_h._M_buckets =
       &(this->CompilationFile).Config._M_h._M_single_bucket;
  (this->CompilationFile).Config._M_h._M_bucket_count = 1;
  (this->CompilationFile).Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CompilationFile).Config._M_h._M_element_count = 0;
  (this->CompilationFile).Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CompilationFile).Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CompilationFile).Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->CompilationFileGenex)._M_dataplus._M_p = (pointer)&(this->CompilationFileGenex).field_2;
  (this->CompilationFileGenex)._M_string_length = 0;
  (this->CompilationFileGenex).field_2._M_local_buf[0] = '\0';
  (this->PredefsCmd).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PredefsCmd).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PredefsCmd).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PredefsFile).Default._M_dataplus._M_p = (pointer)&(this->PredefsFile).Default.field_2;
  (this->PredefsFile).Default._M_string_length = 0;
  (this->PredefsFile).Default.field_2._M_local_buf[0] = '\0';
  (this->PredefsFile).Config._M_h._M_buckets = &(this->PredefsFile).Config._M_h._M_single_bucket;
  (this->PredefsFile).Config._M_h._M_bucket_count = 1;
  (this->PredefsFile).Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->PredefsFile).Config._M_h._M_element_count = 0;
  (this->PredefsFile).Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->PredefsFile).Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->PredefsFile).Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->Defines).Default._M_t._M_impl.super__Rb_tree_header;
  (this->Defines).Default._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Defines).Default._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Defines).Default._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Defines).Default._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->Defines).Default._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Defines).Config._M_h._M_buckets = &(this->Defines).Config._M_h._M_single_bucket;
  (this->Defines).Config._M_h._M_bucket_count = 1;
  (this->Defines).Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Defines).Config._M_h._M_element_count = 0;
  (this->Defines).Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Includes).Default.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Includes).Default.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Includes).Default.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Defines).Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Defines).Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->Includes).Config._M_h._M_buckets = &(this->Includes).Config._M_h._M_single_bucket;
  (this->Includes).Config._M_h._M_bucket_count = 1;
  (this->Includes).Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Includes).Config._M_h._M_element_count = 0;
  (this->Includes).Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Includes).Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Includes).Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->Options).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Options).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Options).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MacroNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MacroNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MacroNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DependFilters).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DependFilters).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DependFilters).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->EmittedBuildPaths)._M_h._M_buckets = &(this->EmittedBuildPaths)._M_h._M_single_bucket;
  (this->EmittedBuildPaths)._M_h._M_bucket_count = 1;
  (this->EmittedBuildPaths)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->EmittedBuildPaths)._M_h._M_element_count = 0;
  (this->EmittedBuildPaths)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->EmittedBuildPaths)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->EmittedBuildPaths)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

MocT()
      : GenVarsT(GenT::MOC)
    {
    }